

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O0

bool __thiscall
CustomWidgetsInfo::extendsOneOf
          (CustomWidgetsInfo *this,QString *classNameIn,QStringList *baseClassNames)

{
  bool bVar1;
  DomCustomWidget *pDVar2;
  CustomWidgetsInfo *in_RDI;
  long in_FS_OFFSET;
  DomCustomWidget *c;
  QString extends;
  QString className;
  undefined4 in_stack_ffffffffffffff88;
  CaseSensitivity in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar3;
  byte local_39;
  QString local_38;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QListSpecialMethods<QString>::contains
                    ((QListSpecialMethods<QString> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),(QString *)in_RDI
                     ,in_stack_ffffffffffffff8c);
  if (bVar1) {
    local_39 = 1;
  }
  else {
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    QString::QString((QString *)in_RDI,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    while( true ) {
      pDVar2 = customWidget(in_RDI,(QString *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (pDVar2 == (DomCustomWidget *)0x0) break;
      local_38.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_38.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      local_38.d.size = -0x5555555555555556;
      DomCustomWidget::elementExtends
                ((DomCustomWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      bVar1 = ::operator==((QString *)in_RDI,
                           (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
      ;
      if (bVar1) {
        local_39 = 0;
        iVar3 = 1;
      }
      else {
        bVar1 = QListSpecialMethods<QString>::contains
                          ((QListSpecialMethods<QString> *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           (QString *)in_RDI,in_stack_ffffffffffffff8c);
        if (bVar1) {
          local_39 = 1;
          iVar3 = 1;
        }
        else {
          QString::operator=(&local_20,&local_38);
          iVar3 = 0;
        }
      }
      QString::~QString((QString *)0x16be87);
      if (iVar3 != 0) goto LAB_0016bea3;
      in_stack_ffffffffffffff9c = 0;
    }
    local_39 = 0;
LAB_0016bea3:
    QString::~QString((QString *)0x16bead);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_39 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool CustomWidgetsInfo::extendsOneOf(const QString &classNameIn,
                                     const QStringList &baseClassNames) const
{
    if (baseClassNames.contains(classNameIn))
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (baseClassNames.contains(extends))
            return true;
        className = extends;
    }
    return false;
}